

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

uchar IDisk::ConvertMFMToByte(uchar *pattern)

{
  uchar b;
  byte bVar1;
  byte bVar2;
  int dec;
  int i;
  ulong uVar3;
  
  bVar2 = 7;
  bVar1 = 0;
  for (uVar3 = 1; uVar3 < 0x10; uVar3 = uVar3 + 2) {
    bVar1 = bVar1 | (byte)((pattern[uVar3] & 1) << (bVar2 & 0x1f));
    bVar2 = bVar2 - 1;
  }
  return bVar1;
}

Assistant:

unsigned char IDisk::ConvertMFMToByte(const unsigned char pattern[16])
{
   unsigned char b = 0;
   auto dec = 7;
   for (auto i = 1; i < 16; i += 2)
   {
      if (i > 2 &&
         (
            (pattern[i - 1] == 1 && pattern[i - 2] == 1)
            || (pattern[i - 1] == 1 && pattern[i] == 1)
            || (pattern[i - 1] == 0 && pattern[i - 2] == 0 && pattern[i] == 0)
         )
      )
      {
      }
      b |= ((pattern[i] & 1) << dec);
      dec--;
   }
   return b;
}